

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

RuleInfo * __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::getRuleInfoForKey(BuildEngineImpl *this,KeyType *key)

{
  bool bVar1;
  undefined4 extraout_var;
  pointer ppVar2;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_48;
  _Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  local_30;
  iterator it;
  KeyID keyID;
  KeyType *key_local;
  BuildEngineImpl *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  ._M_cur._0_4_ = (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[2])(this,key);
  it.
  super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
  ._M_cur._4_4_ = extraout_var;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
       ::find(&this->ruleInfos,(key_type *)&it);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
       ::end(&this->ruleInfos);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_false,_true>
                           *)&local_30);
    this_local = (BuildEngineImpl *)&ppVar2->second;
  }
  else {
    local_40 = it.
               super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
               ._M_cur;
    (*this->delegate->_vptr_BuildEngineDelegate[3])(&local_48,this->delegate,key);
    this_local = (BuildEngineImpl *)addRule(this,(KeyID)local_40._M_cur,&local_48);
    std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
              (&local_48);
  }
  return (RuleInfo *)this_local;
}

Assistant:

RuleInfo& getRuleInfoForKey(const KeyType& key) {
    auto keyID = getKeyID(key);

    // Check if we have already found the rule.
    auto it = ruleInfos.find(keyID);
    if (it != ruleInfos.end())
      return it->second;

    // Otherwise, request it from the delegate and add it.
    return addRule(keyID, delegate.lookupRule(key));
  }